

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ChatLogging.cpp
# Opt level: O0

void __thiscall
RenX_ChatLogPlugin::RenX_OnTeamChat
          (RenX_ChatLogPlugin *this,Server *server,PlayerInfo *player,string_view message)

{
  string_view message_00;
  allocator<char> local_69;
  string local_68;
  RenX_ChatLogPlugin *local_48;
  char *pcStack_40;
  PlayerInfo *local_30;
  PlayerInfo *player_local;
  Server *server_local;
  RenX_ChatLogPlugin *this_local;
  string_view message_local;
  
  pcStack_40 = message._M_str;
  local_48 = (RenX_ChatLogPlugin *)message._M_len;
  local_30 = player;
  player_local = (PlayerInfo *)server;
  server_local = (Server *)this;
  this_local = local_48;
  message_local._M_len = (size_t)pcStack_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"TEAM",&local_69);
  message_00._M_str = pcStack_40;
  message_00._M_len = (size_t)local_48;
  WriteToLog(this,server,player,message_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

void RenX_ChatLogPlugin::RenX_OnTeamChat(RenX::Server& server, const RenX::PlayerInfo& player, std::string_view  message)
{
	WriteToLog(server, player, message, "TEAM");
}